

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommenderCommon.cpp
# Opt level: O0

bool __thiscall
CoreML::Recommender::_ItemSimilarityRecommenderData::operator==
          (_ItemSimilarityRecommenderData *this,_ItemSimilarityRecommenderData *other)

{
  bool bVar1;
  __type _Var2;
  bool local_19;
  _ItemSimilarityRecommenderData *other_local;
  _ItemSimilarityRecommenderData *this_local;
  
  local_19 = false;
  if (this->num_items == other->num_items) {
    bVar1 = std::operator==(&this->item_interactions,&other->item_interactions);
    local_19 = false;
    if (bVar1) {
      bVar1 = std::operator==(&this->item_shift_values,&other->item_shift_values);
      local_19 = false;
      if (bVar1) {
        _Var2 = std::operator==(&this->item_restriction_input_column,
                                &other->item_restriction_input_column);
        local_19 = false;
        if (_Var2) {
          _Var2 = std::operator==(&this->num_recommendations_input_column,
                                  &other->num_recommendations_input_column);
          local_19 = false;
          if (_Var2) {
            _Var2 = std::operator==(&this->item_exclusion_input_column,
                                    &other->item_exclusion_input_column);
            local_19 = false;
            if (_Var2) {
              _Var2 = std::operator==(&this->item_data_input_column,&other->item_data_input_column);
              local_19 = false;
              if (_Var2) {
                _Var2 = std::operator==(&this->item_list_output_column,
                                        &other->item_list_output_column);
                local_19 = false;
                if (_Var2) {
                  _Var2 = std::operator==(&this->item_score_output_column,
                                          &other->item_score_output_column);
                  local_19 = false;
                  if (_Var2) {
                    bVar1 = std::operator==(&this->string_id_values,&other->string_id_values);
                    local_19 = false;
                    if (bVar1) {
                      local_19 = std::operator==(&this->integer_id_values,&other->integer_id_values)
                      ;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_19;
}

Assistant:

bool _ItemSimilarityRecommenderData::operator==(const _ItemSimilarityRecommenderData& other) const {
    return (num_items == other.num_items
            && item_interactions == other.item_interactions
            && item_shift_values == other.item_shift_values
            && item_restriction_input_column == other.item_restriction_input_column
            && num_recommendations_input_column == other.num_recommendations_input_column
            && item_exclusion_input_column == other.item_exclusion_input_column
            && item_data_input_column == other.item_data_input_column
            && item_list_output_column == other.item_list_output_column
            && item_score_output_column == other.item_score_output_column
            && string_id_values == other.string_id_values
            && integer_id_values == other.integer_id_values);

  }